

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void Liby::Signal::reset(int signo)

{
  iterator __it;
  iterator __it_00;
  mapped_type *pp_Var1;
  int in_EDI;
  int local_1c;
  
  local_1c = in_EDI;
  __it = std::
         _Hashtable<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&functors._M_h,&local_1c);
  if (__it.super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>._M_cur !=
      (__node_type *)0x0) {
    std::
    _Hashtable<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&functors._M_h,
            (const_iterator)
            __it.super__Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false>.
            _M_cur);
  }
  __it_00 = std::
            _Hashtable<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&stored_funcs._M_h,&local_1c);
  if (__it_00.super__Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false>._M_cur !=
      (__node_type *)0x0) {
    pp_Var1 = std::__detail::
              _Map_base<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&stored_funcs,&local_1c);
    ::signal(local_1c,(__sighandler_t)*pp_Var1);
    std::
    _Hashtable<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&stored_funcs._M_h,
            (const_iterator)
            __it_00.super__Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false>._M_cur);
  }
  return;
}

Assistant:

void Signal::reset(int signo) {
    auto k = functors.find(signo);
    if (k != functors.end()) {
        functors.erase(k);
    }
    auto k1 = stored_funcs.find(signo);
    if (k1 != stored_funcs.end()) {
        ::signal(signo, stored_funcs[signo]);
        stored_funcs.erase(k1);
    }
}